

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O2

void __thiscall pmx::PmxVertex::Read(PmxVertex *this,istream *stream,PmxSetting *setting)

{
  PmxVertexSkinning *pPVar1;
  _Head_base<0UL,_pmx::PmxVertexSkinningBDEF1_*,_false> _Var2;
  PmxVertexSkinningBDEF1 *in_RAX;
  undefined8 *puVar3;
  int i;
  ulong uVar4;
  float (*pafVar5) [4];
  _Head_base<0UL,_pmx::PmxVertexSkinningBDEF1_*,_false> local_38;
  
  local_38._M_head_impl = in_RAX;
  std::istream::read((char *)stream,(long)this);
  std::istream::read((char *)stream,(long)this->normal);
  std::istream::read((char *)stream,(long)this->uv);
  pafVar5 = this->uva;
  for (uVar4 = 0; uVar4 < setting->uv; uVar4 = uVar4 + 1) {
    std::istream::read((char *)stream,(long)pafVar5);
    pafVar5 = pafVar5 + 1;
  }
  std::istream::read((char *)stream,(long)&this->skinning_type);
  switch(this->skinning_type) {
  case BDEF1:
    std::make_unique<pmx::PmxVertexSkinningBDEF1>();
    _Var2._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (PmxVertexSkinningBDEF1 *)0x0;
    std::__uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>::
    reset((__uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_> *)
          &this->skinning,&(_Var2._M_head_impl)->super_PmxVertexSkinning);
    std::unique_ptr<pmx::PmxVertexSkinningBDEF1,_std::default_delete<pmx::PmxVertexSkinningBDEF1>_>
    ::~unique_ptr((unique_ptr<pmx::PmxVertexSkinningBDEF1,_std::default_delete<pmx::PmxVertexSkinningBDEF1>_>
                   *)&local_38);
    break;
  case BDEF2:
    std::make_unique<pmx::PmxVertexSkinningBDEF2>();
    _Var2._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (PmxVertexSkinningBDEF1 *)0x0;
    std::__uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>::
    reset((__uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_> *)
          &this->skinning,&(_Var2._M_head_impl)->super_PmxVertexSkinning);
    std::unique_ptr<pmx::PmxVertexSkinningBDEF2,_std::default_delete<pmx::PmxVertexSkinningBDEF2>_>
    ::~unique_ptr((unique_ptr<pmx::PmxVertexSkinningBDEF2,_std::default_delete<pmx::PmxVertexSkinningBDEF2>_>
                   *)&local_38);
    break;
  case BDEF4:
    std::make_unique<pmx::PmxVertexSkinningBDEF4>();
    _Var2._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (PmxVertexSkinningBDEF1 *)0x0;
    std::__uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>::
    reset((__uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_> *)
          &this->skinning,&(_Var2._M_head_impl)->super_PmxVertexSkinning);
    std::unique_ptr<pmx::PmxVertexSkinningBDEF4,_std::default_delete<pmx::PmxVertexSkinningBDEF4>_>
    ::~unique_ptr((unique_ptr<pmx::PmxVertexSkinningBDEF4,_std::default_delete<pmx::PmxVertexSkinningBDEF4>_>
                   *)&local_38);
    break;
  case SDEF:
    std::make_unique<pmx::PmxVertexSkinningSDEF>();
    _Var2._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (PmxVertexSkinningBDEF1 *)0x0;
    std::__uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>::
    reset((__uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_> *)
          &this->skinning,&(_Var2._M_head_impl)->super_PmxVertexSkinning);
    std::unique_ptr<pmx::PmxVertexSkinningSDEF,_std::default_delete<pmx::PmxVertexSkinningSDEF>_>::
    ~unique_ptr((unique_ptr<pmx::PmxVertexSkinningSDEF,_std::default_delete<pmx::PmxVertexSkinningSDEF>_>
                 *)&local_38);
    break;
  case QDEF:
    std::make_unique<pmx::PmxVertexSkinningQDEF>();
    _Var2._M_head_impl = local_38._M_head_impl;
    local_38._M_head_impl = (PmxVertexSkinningBDEF1 *)0x0;
    std::__uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>::
    reset((__uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_> *)
          &this->skinning,&(_Var2._M_head_impl)->super_PmxVertexSkinning);
    std::unique_ptr<pmx::PmxVertexSkinningQDEF,_std::default_delete<pmx::PmxVertexSkinningQDEF>_>::
    ~unique_ptr((unique_ptr<pmx::PmxVertexSkinningQDEF,_std::default_delete<pmx::PmxVertexSkinningQDEF>_>
                 *)&local_38);
    break;
  default:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = "invalid skinning type";
    __cxa_throw(puVar3,&char_const*::typeinfo,0);
  }
  pPVar1 = (this->skinning)._M_t.
           super___uniq_ptr_impl<pmx::PmxVertexSkinning,_std::default_delete<pmx::PmxVertexSkinning>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxVertexSkinning_*,_std::default_delete<pmx::PmxVertexSkinning>_>
           .super__Head_base<0UL,_pmx::PmxVertexSkinning_*,_false>._M_head_impl;
  (**pPVar1->_vptr_PmxVertexSkinning)(pPVar1,stream,setting);
  std::istream::read((char *)stream,(long)&this->edge);
  return;
}

Assistant:

void PmxVertex::Read(std::istream *stream, PmxSetting *setting)
	{
		stream->read((char*) this->positon, sizeof(float) * 3);
		stream->read((char*) this->normal, sizeof(float) * 3);
		stream->read((char*) this->uv, sizeof(float) * 2);
		for (int i = 0; i < setting->uv; ++i)
		{
			stream->read((char*) this->uva[i], sizeof(float) * 4);
		}
		stream->read((char*) &this->skinning_type, sizeof(PmxVertexSkinningType));
		switch (this->skinning_type)
		{
		case PmxVertexSkinningType::BDEF1:
			this->skinning = std::make_unique<PmxVertexSkinningBDEF1>();
			break;
		case PmxVertexSkinningType::BDEF2:
			this->skinning = std::make_unique<PmxVertexSkinningBDEF2>();
			break;
		case PmxVertexSkinningType::BDEF4:
			this->skinning = std::make_unique<PmxVertexSkinningBDEF4>();
			break;
		case PmxVertexSkinningType::SDEF:
			this->skinning = std::make_unique<PmxVertexSkinningSDEF>();
			break;
		case PmxVertexSkinningType::QDEF:
			this->skinning = std::make_unique<PmxVertexSkinningQDEF>();
			break;
		default:
			throw "invalid skinning type";
		}
		this->skinning->Read(stream, setting);
		stream->read((char*) &this->edge, sizeof(float));
	}